

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O3

void __thiscall MARS::f_trans(MARS *this,uint *a,uint *b,uint *c,uint *d,uint i)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = *a;
  uVar3 = (this->K)._M_elems[i * 2 + 4] + uVar4;
  uVar7 = uVar4 << 0xd | uVar4 >> 0x13;
  uVar4 = (this->K)._M_elems[i * 2 + 5] * uVar7;
  uVar6 = uVar4 * 0x20 | uVar4 >> 0x1b;
  bVar1 = (byte)uVar6 & 0x1f;
  uVar5 = uVar4 * 0x400 | uVar4 >> 0x16;
  uVar6 = uVar6 ^ (this->S)._M_elems[uVar3 & 0x1ff] ^ uVar5;
  bVar2 = (byte)(uVar4 >> 0x16) & 0x1f;
  *a = uVar7;
  *c = *c + (uVar3 << bVar1 | uVar3 >> 0x20 - bVar1);
  *b = *b + (uVar6 << bVar2 | uVar6 >> 0x20 - bVar2);
  *d = *d ^ uVar5;
  return;
}

Assistant:

void MARS::f_trans(unsigned &a, unsigned &b, unsigned &c, unsigned &d, unsigned i) {
    auto[out1, out2, out3] = e_func(a, K[2 * i + 4], K[2 * i + 5]);
    a = rotl(a, 13);
    c += out2;
    b += out1;
    d = d ^ out3;
}